

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeWriter.cpp
# Opt level: O2

void __thiscall CodeWriter::finish(CodeWriter *this)

{
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"main_end",&local_31);
  tag(this,&local_30,false);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::append((string *)this);
  std::__cxx11::string::append((string *)this);
  return;
}

Assistant:

void CodeWriter::finish() {
    tag("main_end");
    moonOutput += halt;
    moonOutput += newLine;
}